

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

float64 commonNaNToFloat64(commonNaNT a,float_status *status)

{
  uint64_t mantissa;
  float_status *status_local;
  
  if (status->default_nan_mode == '\0') {
    if (a.high >> 0xc == 0) {
      status_local = (float_status *)float64_default_nan_tricore(status);
    }
    else {
      status_local = (float_status *)(a._0_8_ << 0x3f | 0x7ff0000000000000 | a.high >> 0xc);
    }
  }
  else {
    status_local = (float_status *)float64_default_nan_tricore(status);
  }
  return (float64)status_local;
}

Assistant:

static float64 commonNaNToFloat64(commonNaNT a, float_status *status)
{
    uint64_t mantissa = a.high >> 12;

    if (status->default_nan_mode) {
        return float64_default_nan(status);
    }

    if (mantissa) {
        return make_float64(
              (((uint64_t) a.sign) << 63)
            | UINT64_C(0x7FF0000000000000)
            | (a.high >> 12));
    } else {
        return float64_default_nan(status);
    }
}